

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_internal_serialise_particle_to_buffer(mcpl_particle_t *particle,mcpl_outfileinternal_t *f)

{
  double dVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_18 [3];
  
  dVar1 = particle->direction[0];
  if (1e-05 < ABS(particle->direction[2] * particle->direction[2] +
                  dVar1 * dVar1 + particle->direction[1] * particle->direction[1] + -1.0)) {
    pcVar8 = "attempting to add particle with non-unit direction vector";
  }
  else {
    if (0.0 <= particle->ekin) {
      dVar9 = ABS(dVar1);
      dVar2 = particle->direction[1];
      local_18[2] = particle->direction[2];
      dVar10 = ABS(dVar2);
      dVar11 = dVar10;
      if (dVar10 <= dVar9) {
        dVar11 = dVar9;
      }
      if ((double)(~-(ulong)NAN(dVar9) & (ulong)dVar11 | -(ulong)NAN(dVar9) & (ulong)dVar10) <=
          ABS(local_18[2])) {
        local_18[0] = dVar1;
        local_18[1] = dVar2;
      }
      else {
        local_18[1] = (double)(~-(ulong)(local_18[2] != 0.0) & 0x7ff0000000000000 |
                              (ulong)(1.0 / local_18[2]) & -(ulong)(local_18[2] != 0.0));
        if (dVar10 <= dVar9) {
          local_18[0] = local_18[1];
          local_18[1] = dVar2;
          local_18[2] = dVar1;
        }
        else {
          local_18[0] = dVar1;
          local_18[2] = dVar2;
        }
      }
      local_18[2] = (double)((ulong)ABS(particle->ekin) | (ulong)local_18[2] & 0x8000000000000000);
      if (f->opt_singleprec == 0) {
        if (f->opt_polarisation == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = 0;
          do {
            *(double *)(f->particle_buffer + lVar3 * 8) = particle->polarisation[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          lVar3 = 0x18;
        }
        lVar7 = 0;
        do {
          *(double *)(f->particle_buffer + lVar7 * 8 + lVar3) = particle->position[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        *(double *)(f->particle_buffer + lVar3 + 0x28) = local_18[2];
        *(double *)(f->particle_buffer + lVar3 + 0x18) = local_18[0];
        *(double *)(f->particle_buffer + lVar3 + 0x20) = local_18[1];
        *(double *)(f->particle_buffer + lVar3 + 0x30) = particle->time;
        uVar6 = lVar3 + 0x38;
        if ((f->opt_universalweight == 0.0) && (!NAN(f->opt_universalweight))) {
          *(double *)(f->particle_buffer + lVar3 + 0x38) = particle->weight;
          uVar6 = (ulong)((uint)lVar3 | 0x40);
        }
      }
      else {
        if (f->opt_polarisation == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = 0;
          do {
            *(float *)(f->particle_buffer + lVar3 * 4) = (float)particle->polarisation[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          lVar3 = 0xc;
        }
        lVar7 = 0;
        do {
          lVar5 = lVar7;
          *(float *)(f->particle_buffer + lVar5 + lVar3 + 0x84 + -0x84) =
               (float)*(double *)((long)particle->position + lVar5 * 2);
          lVar7 = lVar5 + 4;
        } while (lVar5 + 4 != 0xc);
        lVar7 = 0;
        do {
          *(float *)(f->particle_buffer + lVar7 + lVar3 + 0x84 + -0x78) =
               (float)*(double *)((long)local_18 + lVar7 * 2);
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0xc);
        *(float *)(f->particle_buffer + lVar5 + lVar3 + 0xc + 4) = (float)particle->time;
        if ((f->opt_universalweight != 0.0) || (NAN(f->opt_universalweight))) {
          uVar6 = (ulong)((int)lVar3 + 0x1c);
        }
        else {
          *(float *)(f->particle_buffer + lVar5 + lVar3 + 0xc + 8) = (float)particle->weight;
          uVar6 = (ulong)((int)lVar3 + 0x20);
        }
      }
      uVar4 = (uint)uVar6;
      if (f->opt_universalpdgcode == 0) {
        *(int32_t *)(f->particle_buffer + uVar6) = particle->pdgcode;
        uVar4 = uVar4 + 4;
      }
      if (f->opt_userflags != 0) {
        *(uint32_t *)(f->particle_buffer + uVar4) = particle->userflags;
      }
      return;
    }
    pcVar8 = "attempting to add particle with negative kinetic energy";
  }
  (*mcpl_error_handler)(pcVar8);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_internal_serialise_particle_to_buffer( const mcpl_particle_t* particle,
                                                            mcpl_outfileinternal_t * f ) {

  //Serialise the provided particle into the particle_buffer of the output file
  //(according to the settings of the output file).

  double pack_ekindir[3];

  //Sanity check (add more??):
  double dirsq = particle->direction[0] * particle->direction[0]
    + particle->direction[1] * particle->direction[1]
    + particle->direction[2] * particle->direction[2];
  if (fabs(dirsq-1.0)>1.0e-5)
    mcpl_error("attempting to add particle with non-unit direction vector");
  if (particle->ekin<0.0)
    mcpl_error("attempting to add particle with negative kinetic energy");
  //direction and ekin are packed into 3 doubles:
  mcpl_unitvect_pack_adaptproj(particle->direction,pack_ekindir);
  //pack_ekindir[2] is now just a sign(1.0 or -1.0), so we can store the
  //ekin in that field as well (since it must be non-negative). We use copysign
  //to be sure the signbit is set also if ekin=0:
  pack_ekindir[2] = copysign(particle->ekin,pack_ekindir[2]);

  //serialise particle object to buffer:
  unsigned ibuf = 0;
  char * pbuf = &(f->particle_buffer[0]);
  int i;
  if (f->opt_singleprec) {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(float*)&pbuf[ibuf] = (float)particle->polarisation[i];
        ibuf += sizeof(float);
      }
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)particle->position[i];
      ibuf += sizeof(float);
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)pack_ekindir[i];
      ibuf += sizeof(float);
    }
    *(float*)&pbuf[ibuf] = (float)particle->time;
    ibuf += sizeof(float);
    if (!f->opt_universalweight) {
      *(float*)&pbuf[ibuf] = (float)particle->weight;
      ibuf += sizeof(float);
    }
  } else {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(double*)&pbuf[ibuf] = particle->polarisation[i];
        ibuf += sizeof(double);
      }
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = particle->position[i];
      ibuf += sizeof(double);
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = pack_ekindir[i];
      ibuf += sizeof(double);
    }
    *(double*)&pbuf[ibuf] = particle->time;
    ibuf += sizeof(double);
    if (!f->opt_universalweight) {
      *(double*)&pbuf[ibuf] = particle->weight;
      ibuf += sizeof(double);
    }
  }
  if (!f->opt_universalpdgcode) {
    *(int32_t*)&pbuf[ibuf] = particle->pdgcode;
    ibuf += sizeof(int32_t);
  }
  if (f->opt_userflags) {
    *(uint32_t*)&pbuf[ibuf] = particle->userflags;
#ifndef NDEBUG
    ibuf += sizeof(uint32_t);
#endif
  }
  assert(ibuf==f->particle_size);
}